

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_inflateInit2(mz_streamp pStream,int window_bits)

{
  undefined4 *puVar1;
  int in_ESI;
  long in_RDI;
  inflate_state *pDecomp;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else if ((in_ESI == 0xf) || (in_ESI == -0xf)) {
    *(undefined4 *)(in_RDI + 0x58) = 0;
    *(undefined8 *)(in_RDI + 0x60) = 0;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0;
    *(undefined8 *)(in_RDI + 0x68) = 0;
    if (*(long *)(in_RDI + 0x40) == 0) {
      *(code **)(in_RDI + 0x40) = (anonymous_namespace)::miniz::def_alloc_func;
    }
    if (*(long *)(in_RDI + 0x48) == 0) {
      *(code **)(in_RDI + 0x48) = (anonymous_namespace)::miniz::def_free_func;
    }
    puVar1 = (undefined4 *)(**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x50),1,0xab10);
    if (puVar1 == (undefined4 *)0x0) {
      local_4 = -4;
    }
    else {
      *(undefined4 **)(in_RDI + 0x38) = puVar1;
      *puVar1 = 0;
      puVar1[0xabe] = 0;
      puVar1[0xabf] = 0;
      puVar1[0x2ac3] = 1;
      puVar1[0xac0] = 1;
      puVar1[0xac1] = 0;
      puVar1[0xac2] = in_ESI;
      local_4 = 0;
    }
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int mz_inflateInit2(mz_streamp pStream, int window_bits) {
  inflate_state *pDecomp;
  if (!pStream)
    return MZ_STREAM_ERROR;
  if ((window_bits != MZ_DEFAULT_WINDOW_BITS) &&
      (-window_bits != MZ_DEFAULT_WINDOW_BITS))
    return MZ_PARAM_ERROR;

  pStream->data_type = 0;
  pStream->adler = 0;
  pStream->msg = NULL;
  pStream->total_in = 0;
  pStream->total_out = 0;
  pStream->reserved = 0;
  if (!pStream->zalloc)
    pStream->zalloc = def_alloc_func;
  if (!pStream->zfree)
    pStream->zfree = def_free_func;

  pDecomp = (inflate_state *)pStream->zalloc(pStream->opaque, 1,
                                             sizeof(inflate_state));
  if (!pDecomp)
    return MZ_MEM_ERROR;

  pStream->state = (struct mz_internal_state *)pDecomp;

  tinfl_init(&pDecomp->m_decomp);
  pDecomp->m_dict_ofs = 0;
  pDecomp->m_dict_avail = 0;
  pDecomp->m_last_status = TINFL_STATUS_NEEDS_MORE_INPUT;
  pDecomp->m_first_call = 1;
  pDecomp->m_has_flushed = 0;
  pDecomp->m_window_bits = window_bits;

  return MZ_OK;
}